

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy>::
decode_lines(jls_codec<charls::lossless_traits<unsigned_short,_16>,_charls::decoder_strategy> *this)

{
  uint uVar1;
  process_line *ppVar2;
  int iVar3;
  uint uVar4;
  unsigned_short *__tmp;
  pixel_type *ppVar5;
  pointer puVar6;
  pointer piVar7;
  uint uVar8;
  pixel_type *ppVar9;
  pixel_type *ppVar10;
  uint uVar11;
  uint uVar12;
  size_t component;
  long lVar13;
  size_type sVar14;
  ulong uVar15;
  size_type __n;
  allocator_type local_81;
  vector<int,_std::allocator<int>_> run_index;
  vector<unsigned_short,_std::allocator<unsigned_short>_> line_buffer;
  
  uVar15 = (ulong)(this->width_ + 4);
  if ((this->super_decoder_strategy).parameters_.interleave_mode == Line) {
    iVar3 = (this->super_decoder_strategy).frame_info_.component_count;
  }
  else {
    iVar3 = 1;
  }
  __n = (size_type)iVar3;
  lVar13 = __n * uVar15;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&line_buffer,lVar13 * 2,(allocator_type *)&run_index);
  std::vector<int,_std::allocator<int>_>::vector(&run_index,__n,&local_81);
  uVar11 = 0;
  while( true ) {
    uVar8 = (this->super_decoder_strategy).frame_info_.height - uVar11;
    if (this->restart_interval_ < uVar8) {
      uVar8 = this->restart_interval_;
    }
    uVar4 = uVar8 + uVar11;
    for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
      ppVar9 = line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start + 1;
      this->previous_line_ = ppVar9;
      ppVar10 = line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_start + lVar13 + 1;
      this->current_line_ = ppVar10;
      ppVar5 = ppVar10;
      if ((uVar11 & 1) != 0) {
        this->previous_line_ = ppVar10;
        this->current_line_ = ppVar9;
        ppVar5 = ppVar9;
        ppVar9 = ppVar10;
      }
      for (sVar14 = 0; __n != sVar14; sVar14 = sVar14 + 1) {
        this->run_index_ =
             run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[sVar14];
        ppVar9[this->width_] = ppVar9[this->width_ - 1];
        ppVar5[-1] = *ppVar9;
        do_line(this,(sample_type *)0x0);
        run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar14] = this->run_index_;
        ppVar9 = this->previous_line_ + uVar15;
        this->previous_line_ = ppVar9;
        ppVar5 = this->current_line_ + uVar15;
        this->current_line_ = ppVar5;
      }
      uVar1 = (this->rect_).Y;
      if ((uVar1 <= uVar11) && (uVar11 < uVar1 + (this->rect_).Height)) {
        ppVar2 = (this->super_decoder_strategy).process_line_._M_t.
                 super___uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_charls::process_line_*,_std::default_delete<charls::process_line>_>
                 .super__Head_base<0UL,_charls::process_line_*,_false>._M_head_impl;
        (*ppVar2->_vptr_process_line[2])
                  (ppVar2,ppVar5 + ((this->rect_).X - lVar13),(long)(this->rect_).Width,uVar15);
      }
      uVar11 = uVar11 + 1;
    }
    if (uVar4 == (this->super_decoder_strategy).frame_info_.height) break;
    read_restart_marker(this);
    this->restart_interval_counter_ = this->restart_interval_counter_ + 1 & 7;
    decoder_strategy::reset(&this->super_decoder_strategy);
    for (puVar6 = line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar7 = run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
        puVar6 != line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
      *puVar6 = 0;
    }
    for (; piVar7 != run_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish; piVar7 = piVar7 + 1) {
      *piVar7 = 0;
    }
    reset_parameters(this);
    uVar11 = uVar4;
  }
  decoder_strategy::end_scan(&this->super_decoder_strategy);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&run_index.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&line_buffer.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  return;
}

Assistant:

void decode_lines()
    {
        const uint32_t pixel_stride{width_ + 4U};
        const size_t component_count{
            parameters().interleave_mode == interleave_mode::line ? static_cast<size_t>(frame_info().component_count) : 1U};

        std::vector<pixel_type> line_buffer(component_count * pixel_stride * 2);
        std::vector<int32_t> run_index(component_count);

        for (uint32_t line{};;)
        {
            const uint32_t lines_in_interval{std::min(frame_info().height - line, restart_interval_)};

            for (uint32_t mcu{}; mcu < lines_in_interval; ++mcu, ++line)
            {
                previous_line_ = &line_buffer[1];
                current_line_ = &line_buffer[1 + static_cast<size_t>(component_count) * pixel_stride];
                if ((line & 1) == 1)
                {
                    std::swap(previous_line_, current_line_);
                }

                for (size_t component{}; component < component_count; ++component)
                {
                    run_index_ = run_index[component];

                    // initialize edge pixels used for prediction
                    previous_line_[width_] = previous_line_[width_ - 1];
                    current_line_[-1] = previous_line_[0];
                    do_line(static_cast<pixel_type*>(nullptr)); // dummy argument for overload resolution

                    run_index[component] = run_index_;
                    previous_line_ += pixel_stride;
                    current_line_ += pixel_stride;
                }

                // Only copy the line if it is part of the output rectangle.
                if (static_cast<uint32_t>(rect_.Y) <= line && line < static_cast<uint32_t>(rect_.Y + rect_.Height))
                {
                    Strategy::on_line_end(current_line_ + rect_.X - (static_cast<size_t>(component_count) * pixel_stride),
                                          rect_.Width,
                                          pixel_stride);
                }
            }

            if (line == frame_info().height)
                break;

            // At this point in the byte stream a restart marker should be present: process it.
            read_restart_marker();
            restart_interval_counter_ = (restart_interval_counter_ + 1) % jpeg_restart_marker_range;

            // After a restart marker it is required to reset the decoder.
            Strategy::reset();
            std::fill(line_buffer.begin(), line_buffer.end(), pixel_type{});
            std::fill(run_index.begin(), run_index.end(), 0);
            reset_parameters();
        }

        Strategy::end_scan();
    }